

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  int iVar8;
  ImU32 IVar9;
  uint uVar10;
  GetterXsYs<unsigned_long_long> *pGVar11;
  GetterXsYRef<unsigned_long_long> *pGVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  double dVar15;
  double dVar16;
  ImDrawIdx IVar17;
  long lVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  
  pGVar11 = this->Getter1;
  pGVar12 = this->Getter2;
  iVar7 = pGVar11->Count;
  lVar18 = (long)(((pGVar11->Offset + prim) % iVar7 + iVar7) % iVar7) * (long)pGVar11->Stride;
  uVar2 = *(unsigned_long_long *)((long)pGVar11->Xs + lVar18);
  uVar3 = *(unsigned_long_long *)((long)pGVar11->Ys + lVar18);
  iVar7 = this->Transformer->YAxis;
  dVar15 = (double)GImPlot->PixelRange[iVar7].Min.x;
  dVar4 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar26 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) - dVar4) *
                   GImPlot->Mx + dVar15);
  dVar16 = (double)GImPlot->PixelRange[iVar7].Min.y;
  dVar5 = GImPlot->CurrentPlot->YAxis[iVar7].Range.Min;
  fVar27 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) - dVar5) *
                   GImPlot->My[iVar7] + dVar16);
  iVar8 = pGVar12->Count;
  uVar2 = *(unsigned_long_long *)
           ((long)pGVar12->Xs +
           (long)(((prim + pGVar12->Offset) % iVar8 + iVar8) % iVar8) * (long)pGVar12->Stride);
  fVar21 = (float)(((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) - dVar4) *
                   GImPlot->Mx + dVar15);
  fVar22 = (float)((pGVar12->YRef - dVar5) * GImPlot->My[iVar7] + dVar16);
  fVar24 = fVar27;
  if (fVar22 <= fVar27) {
    fVar24 = fVar22;
  }
  bVar19 = false;
  if ((fVar24 < (cull_rect->Max).y) &&
     (fVar24 = (float)(~-(uint)(fVar22 <= fVar27) & (uint)fVar22 |
                      -(uint)(fVar22 <= fVar27) & (uint)fVar27), pfVar1 = &(cull_rect->Min).y,
     bVar19 = false, *pfVar1 <= fVar24 && fVar24 != *pfVar1)) {
    fVar24 = fVar26;
    if (fVar21 <= fVar26) {
      fVar24 = fVar21;
    }
    if (fVar24 < (cull_rect->Max).x) {
      fVar24 = (float)(~-(uint)(fVar21 <= fVar26) & (uint)fVar21 |
                      -(uint)(fVar21 <= fVar26) & (uint)fVar26);
      bVar19 = (cull_rect->Min).x <= fVar24 && fVar24 != (cull_rect->Min).x;
    }
  }
  if (bVar19 != false) {
    fVar24 = this->Weight;
    IVar9 = this->Col;
    IVar6 = *uv;
    fVar23 = fVar21 - fVar26;
    fVar25 = fVar22 - fVar27;
    fVar20 = fVar23 * fVar23 + fVar25 * fVar25;
    if (0.0 < fVar20) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar23 = fVar23 * (1.0 / fVar20);
      fVar25 = fVar25 * (1.0 / fVar20);
    }
    fVar24 = fVar24 * 0.5;
    fVar23 = fVar23 * fVar24;
    fVar24 = fVar24 * fVar25;
    pIVar13 = DrawList->_VtxWritePtr;
    (pIVar13->pos).x = fVar24 + fVar26;
    (pIVar13->pos).y = fVar27 - fVar23;
    pIVar13->uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = IVar9;
    pIVar13[1].pos.x = fVar24 + fVar21;
    pIVar13[1].pos.y = fVar22 - fVar23;
    pIVar13[1].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = IVar9;
    pIVar13[2].pos.x = fVar21 - fVar24;
    pIVar13[2].pos.y = fVar23 + fVar22;
    pIVar13[2].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = IVar9;
    pIVar13[3].pos.x = fVar26 - fVar24;
    pIVar13[3].pos.y = fVar23 + fVar27;
    pIVar13[3].uv = IVar6;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar13 + 4;
    uVar10 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar10;
    *pIVar14 = IVar17;
    pIVar14[1] = IVar17 + 1;
    pIVar14[2] = IVar17 + 2;
    pIVar14[3] = IVar17;
    pIVar14[4] = IVar17 + 2;
    pIVar14[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar10 + 4;
  }
  return bVar19;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }